

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgtool.c
# Opt level: O2

void nts(frameex1 *fxp)

{
  fnhead *fnobj;
  
  fnobj = (fnhead *)
          NativeAligned4FromLAddr
                    (*(LispPTR *)
                      ((long)&fxp->fnheader + (ulong)(*(ushort *)&fxp->field_0x2 >> 6 & 8)));
  ntheader(fnobj);
  return;
}

Assistant:

void nts(struct frameex1 *fxp) {
  struct fnhead *nt;

#ifdef BIGVM
  if (fxp->validnametable)
    nt = (struct fnhead *)NativeAligned4FromLAddr(fxp->nametable);
  else
    nt = (struct fnhead *)NativeAligned4FromLAddr(fxp->fnheader);
#else
  if (fxp->validnametable)
    nt = (struct fnhead *)NativeAligned4FromLAddr(((fxp->hi2nametable) << 16 | fxp->lonametable));
  else
    nt = (struct fnhead *)NativeAligned4FromLAddr(((fxp->hi2fnheader) << 16 | fxp->lofnheader));
#endif /* BIGVM */
  ntheader(nt);
}